

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O3

Lookups * verona::lookdown(Lookups *__return_storage_ptr__,Lookup *lookup,Node *id,Node *ta,
                          NodeSet *visited)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  TokenDef *pTVar2;
  _Base_ptr p_Var3;
  undefined8 *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer psVar5;
  _Rb_tree_const_iterator<verona::Lookup> __first;
  NodeMap<Node> *pNVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Token *pTVar9;
  _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
  *p_Var10;
  _Rb_tree_header *p_Var11;
  iterator iVar12;
  const_iterator __position;
  _Rb_tree_color _Var13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  _Base_ptr *__r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  pointer psVar16;
  pair<std::_Rb_tree_iterator<std::shared_ptr<trieste::NodeDef>_>,_bool> pVar17;
  Lookup l;
  Lookups ldefs;
  Nodes defs;
  undefined1 local_188 [16];
  _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
  local_178;
  bool local_148;
  _Base_ptr local_140;
  Node *local_138;
  Node *local_130;
  Node local_128;
  Node local_118;
  Node local_108;
  Node local_f8;
  Node local_e8;
  Node local_d8;
  Lookup local_c8;
  NodeMap<Node> *local_80;
  Nodes local_78;
  _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::_Identity<std::shared_ptr<trieste::NodeDef>_>,_std::owner_less<void>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
  local_60;
  
  if ((lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    p_Var11 = &local_178._M_impl.super__Rb_tree_header;
    this = &(lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    local_80 = &lookup->bindings;
    local_140 = &(lookup->bindings)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_138 = id;
    local_130 = ta;
    do {
      pVar17 = ::std::
               _Rb_tree<std::shared_ptr<trieste::NodeDef>,std::shared_ptr<trieste::NodeDef>,std::_Identity<std::shared_ptr<trieste::NodeDef>>,std::owner_less<void>,std::allocator<std::shared_ptr<trieste::NodeDef>>>
               ::_M_insert_unique<std::shared_ptr<trieste::NodeDef>const&>
                         ((_Rb_tree<std::shared_ptr<trieste::NodeDef>,std::shared_ptr<trieste::NodeDef>,std::_Identity<std::shared_ptr<trieste::NodeDef>>,std::owner_less<void>,std::allocator<std::shared_ptr<trieste::NodeDef>>>
                           *)visited,&lookup->def);
      if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
      local_188._0_8_ = Class;
      local_188._8_8_ = Trait;
      local_178._M_impl._0_8_ = Function;
      pTVar9 = ::std::
               __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                         ((Lookup *)local_188,p_Var11,
                          &((lookup->def).
                            super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->type_);
      if ((_Rb_tree_header *)pTVar9 != p_Var11) {
        p_Var11 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var11->_M_header;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var11->_M_header;
        (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
        trieste::NodeDef::lookdown
                  (&local_78,
                   (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&((local_138->
                            super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           )->location_);
        if (local_78.
            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_78.
            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          __position._M_node =
               (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          psVar16 = local_78.
                    super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            local_d8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (psVar16->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_d8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (psVar16->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
            if (local_d8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_d8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_d8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_d8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_d8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            Lookup::make((Lookup *)local_188,lookup,&local_d8);
            if (local_d8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_d8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            local_e8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (local_130->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
            local_e8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (local_130->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
            if (local_e8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_e8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_e8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_e8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_e8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            apply_typeargs((Lookup *)local_188,&local_e8);
            if (local_e8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_e8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            local_c8.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 local_178._M_impl.super__Rb_tree_header._M_header._M_parent;
            local_c8.def.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_188._0_8_;
            local_c8.def.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_;
            local_188._0_8_ = (element_type *)0x0;
            local_188._8_8_ = (element_type *)0x0;
            if (local_178._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
              _Var13 = _S_red;
              local_c8.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_c8.bindings._M_t._M_impl.super__Rb_tree_header._M_header;
              pNVar6 = &local_c8.bindings;
              local_c8.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_c8.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            else {
              (local_178._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                   &local_c8.bindings._M_t._M_impl.super__Rb_tree_header._M_header;
              local_c8.bindings._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   local_178._M_impl.super__Rb_tree_header._M_node_count;
              local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              p_Var11 = &local_178._M_impl.super__Rb_tree_header;
              pNVar6 = (NodeMap<Node> *)&local_178._M_impl;
              local_c8.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   local_178._M_impl.super__Rb_tree_header._M_header._M_left;
              local_c8.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_178._M_impl.super__Rb_tree_header._M_header._M_right;
              _Var13 = local_178._M_impl.super__Rb_tree_header._M_header._M_color;
              local_178._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var11->_M_header;
              local_178._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var11->_M_header;
            }
            *(size_t *)((long)&(pNVar6->_M_t)._M_impl.super__Rb_tree_header + 0x20) = 0;
            local_c8.too_many_typeargs = local_148;
            local_c8.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var13;
            ::std::
            _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
            ::~_Rb_tree(&local_178);
            if ((element_type *)local_188._8_8_ != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
            }
            local_188._0_8_ = __return_storage_ptr__;
            iVar12 = ::std::
                     _Rb_tree<verona::Lookup,verona::Lookup,std::_Identity<verona::Lookup>,std::less<verona::Lookup>,std::allocator<verona::Lookup>>
                     ::
                     _M_insert_unique_<verona::Lookup,std::_Rb_tree<verona::Lookup,verona::Lookup,std::_Identity<verona::Lookup>,std::less<verona::Lookup>,std::allocator<verona::Lookup>>::_Alloc_node>
                               ((_Rb_tree<verona::Lookup,verona::Lookup,std::_Identity<verona::Lookup>,std::less<verona::Lookup>,std::allocator<verona::Lookup>>
                                 *)__return_storage_ptr__,__position,&local_c8,
                                (_Alloc_node *)local_188);
            __position._M_node = (_Base_ptr)::std::_Rb_tree_increment(iVar12._M_node);
            ::std::
            _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
            ::~_Rb_tree(&local_c8.bindings._M_t);
            if ((element_type *)
                local_c8.def.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_c8.def.
                         super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            psVar16 = psVar16 + 1;
          } while (psVar16 !=
                   local_78.
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        ::std::
        vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
        ::~vector((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   *)&local_78);
        return __return_storage_ptr__;
      }
      peVar1 = (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      pTVar2 = (peVar1->type_).def;
      if (pTVar2 == (TokenDef *)TypeAlias) {
        local_c8.def.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)Type;
        trieste::operator/((WFLookup *)local_188,&lookup->def,(Token *)&local_c8);
        (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_188._8_8_;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (this,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_178);
        this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._M_impl._0_8_;
LAB_00154498:
        if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
        }
      }
      else {
        if (pTVar2 == (TokenDef *)TypeParam) {
          p_Var14 = (lookup->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var14 == (_Base_ptr)0x0) break;
          p_Var3 = (_Base_ptr)this->_M_pi;
          p_Var15 = local_140;
          do {
            if (*(_Base_ptr *)((long)(p_Var14 + 1) + 8) >= p_Var3) {
              p_Var15 = p_Var14;
            }
            p_Var14 = (&p_Var14->_M_left)[*(_Base_ptr *)((long)(p_Var14 + 1) + 8) < p_Var3];
          } while (p_Var14 != (_Base_ptr)0x0);
          if (((p_Var15 == local_140) || (p_Var3 < p_Var15[1]._M_parent)) ||
             ((((element_type *)p_Var15[1]._M_left)->type_).def == (TokenDef *)TypeParamBind))
          break;
          (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var15[1]._M_left;
          __r = &p_Var15[1]._M_right;
        }
        else {
          if (pTVar2 != (TokenDef *)Type) {
            local_188._0_8_ = FQType;
            local_188._8_8_ = FQFunction;
            p_Var10 = (_Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
                       *)::std::
                         __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                                   ((Lookup *)local_188,&local_178,&peVar1->type_);
            if (p_Var10 != &local_178) {
              local_f8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              local_f8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
              if (local_f8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_f8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_f8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_f8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_f8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              resolve_fq((Lookup *)local_188,&local_f8);
              uVar8 = local_188._8_8_;
              uVar7 = local_188._0_8_;
              local_188._0_8_ = (element_type *)0x0;
              local_188._8_8_ = (element_type *)0x0;
              this_00 = (lookup->def).
                        super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                        ._M_pi;
              (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)uVar7;
              (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
              ::std::
              _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
              ::clear(&local_80->_M_t);
              if (local_178._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                (lookup->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_178._M_impl.super__Rb_tree_header._M_header._M_color;
                (lookup->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_178._M_impl.super__Rb_tree_header._M_header._M_parent;
                (lookup->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_178._M_impl.super__Rb_tree_header._M_header._M_left;
                (lookup->bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_178._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_178._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = local_140
                ;
                (lookup->bindings)._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     local_178._M_impl.super__Rb_tree_header._M_node_count;
                local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_178._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var11->_M_header;
                local_178._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var11->_M_header;
              }
              lookup->too_many_typeargs = local_148;
              ::std::
              _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
              ::~_Rb_tree(&local_178);
              this_01._M_pi =
                   local_f8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if ((element_type *)local_188._8_8_ != (element_type *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
                this_01._M_pi =
                     local_f8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
              goto LAB_00154498;
            }
            peVar1 = (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            pTVar2 = (peVar1->type_).def;
            if (pTVar2 == (TokenDef *)TypeView) {
              psVar16 = *(pointer *)
                         ((long)&(peVar1->children).
                                 super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                                 ._M_impl.super__Vector_impl_data + 8);
              (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = psVar16[-1].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
              ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (this,&psVar16[-1].
                               super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
              goto LAB_001544a2;
            }
            if (pTVar2 == (TokenDef *)TypeIsect) {
              p_Var11 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
              (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color =
                   _S_red;
              (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
                   &p_Var11->_M_header;
              (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                   &p_Var11->_M_header;
              (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
              psVar16 = (peVar1->children).
                        super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              psVar5 = *(pointer *)
                        ((long)&(peVar1->children).
                                super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                                ._M_impl.super__Vector_impl_data + 8);
              if (psVar16 == psVar5) {
                return __return_storage_ptr__;
              }
              do {
                local_108.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (psVar16->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
                local_108.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (psVar16->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
                if (local_108.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_108.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_108.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_108.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_108.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                Lookup::make((Lookup *)local_188,lookup,&local_108);
                if (local_108.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_108.
                             super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                local_118.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (local_138->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
                local_118.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (local_138->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
                if (local_118.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_118.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_118.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_118.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_118.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                local_128.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (local_130->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
                local_128.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (local_130->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
                if (local_128.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_128.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_128.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_128.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_128.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                ::std::
                _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::_Identity<std::shared_ptr<trieste::NodeDef>_>,_std::owner_less<void>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                ::_Rb_tree(&local_60,&visited->_M_t);
                lookdown((Lookups *)&local_c8,(Lookup *)local_188,&local_118,&local_128,
                         (NodeSet *)&local_60);
                ::std::
                _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>,_std::_Identity<std::shared_ptr<trieste::NodeDef>_>,_std::owner_less<void>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                ::~_Rb_tree(&local_60);
                if (local_128.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_128.
                             super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (local_118.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_118.
                             super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                __first._M_node._4_4_ =
                     local_c8.bindings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
                __first._M_node._0_4_ =
                     local_c8.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
                ::std::
                _Rb_tree<verona::Lookup,verona::Lookup,std::_Identity<verona::Lookup>,std::less<verona::Lookup>,std::allocator<verona::Lookup>>
                ::_M_insert_range_unique<std::_Rb_tree_const_iterator<verona::Lookup>>
                          ((_Rb_tree<verona::Lookup,verona::Lookup,std::_Identity<verona::Lookup>,std::less<verona::Lookup>,std::allocator<verona::Lookup>>
                            *)__return_storage_ptr__,__first,
                           (_Rb_tree_const_iterator<verona::Lookup>)
                           &local_c8.def.
                            super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                ::std::
                _Rb_tree<verona::Lookup,_verona::Lookup,_std::_Identity<verona::Lookup>,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
                ::~_Rb_tree((_Rb_tree<verona::Lookup,_verona::Lookup,_std::_Identity<verona::Lookup>,_std::less<verona::Lookup>,_std::allocator<verona::Lookup>_>
                             *)&local_c8);
                ::std::
                _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
                ::~_Rb_tree(&local_178);
                if ((element_type *)local_188._8_8_ != (element_type *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
                }
                psVar16 = psVar16 + 1;
              } while (psVar16 != psVar5);
              return __return_storage_ptr__;
            }
            if (pTVar2 != (TokenDef *)TypeUnion) {
              local_188._0_8_ = TypeList;
              local_188._8_8_ = TypeTuple;
              local_178._M_impl._0_8_ = TypeVar;
              ::std::
              __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                        (local_188,&local_178._M_impl.super__Rb_tree_header,&peVar1->type_);
              (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
              *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header
                   = 0;
              goto LAB_001544bc;
            }
            break;
          }
          puVar4 = (undefined8 *)
                   (peVar1->children).
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          (lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*puVar4;
          __r = (_Base_ptr *)(puVar4 + 1);
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (this,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)__r);
      }
LAB_001544a2:
    } while ((lookup->def).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             != (element_type *)0x0);
  }
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
LAB_001544bc:
  p_Var11 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var11->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var11->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  return __return_storage_ptr__;
}

Assistant:

Lookups lookdown(Lookup& lookup, Node id, Node ta, NodeSet visited)
  {
    while (true)
    {
      // Stop on a failed lookup.
      if (!lookup.def)
        return {};

      // Check if we've visited this node before. If so, we've found a cycle.
      auto inserted = visited.insert(lookup.def);
      if (!inserted.second)
        return {};

      if (lookup.def->in({Class, Trait, Function}))
      {
        // Return all lookdowns in the found class, trait, or function.
        Lookups result;
        auto defs = lookup.def->lookdown(id->location());

        std::transform(
          defs.begin(),
          defs.end(),
          std::inserter(result, result.begin()),
          [&](auto& def) {
            auto l = lookup.make(def);
            apply_typeargs(l, ta);
            return l;
          });

        return result;
      }
      else if (lookup.def == TypeAlias)
      {
        // Replace the def with our type alias and try again.
        lookup.def = lookup.def / Type;
      }
      else if (lookup.def == TypeParam)
      {
        // Replace the typeparam with the bound typearg and try again.
        auto it = lookup.bindings.find(lookup.def);

        // Except in testing, there should always be a binding. If it's bound
        // to itself, then we're done.
        if ((it == lookup.bindings.end()) || (it->second == TypeParamBind))
          return {};

        lookup.def = it->second;
      }
      // The remainder of cases arise from a Use, a TypeAlias, or a TypeParam.
      // They will all result in some number of name resolutions.
      else if (lookup.def == Type)
      {
        // Replace the def with the content of the type and try again.
        // Use `front()` instead of `def / Type` to allow looking up in `use`
        // directives before Type is no longer a sequence.
        lookup.def = lookup.def->front();
      }
      else if (lookup.def->in({FQType, FQFunction}))
      {
        // Resolve the name and try again.
        lookup = resolve_fq(lookup.def);
      }
      else if (lookup.def == TypeView)
      {
        // Replace the def with the rhs of the view and try again.
        lookup.def = lookup.def->back();
      }
      else if (lookup.def == TypeIsect)
      {
        // Return everything we find.
        Lookups result;

        for (auto& t : *lookup.def)
        {
          auto l = lookup.make(t);
          auto ldefs = lookdown(l, id, ta, visited);
          result.insert(ldefs.begin(), ldefs.end());
        }

        return result;
      }
      else if (lookup.def == TypeUnion)
      {
        // TODO: return only things that are identical in all disjunctions
        return {};
      }
      else if (lookup.def->in({TypeList, TypeTuple, TypeVar}))
      {
        // Nothing to do here.
        return {};
      }
      else
      {
        // This type isn't resolved yet.
        return {};
      }
    }
  }